

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReFinalize.cpp
# Opt level: O3

void __thiscall wasm::ReFinalize::visitBreak(ReFinalize *this,Break *curr)

{
  Expression *value;
  Type type;
  
  Break::finalize(curr);
  value = curr->value;
  if (value == (Expression *)0x0) {
    type.id = 0;
  }
  else {
    type.id = (value->type).id;
    if (type.id == 1) {
      replaceUntaken(this,value,curr->condition);
      return;
    }
  }
  updateBreakValueType(this,(Name)(curr->name).super_IString.str,type);
  return;
}

Assistant:

void ReFinalize::visitBreak(Break* curr) {
  curr->finalize();
  auto valueType = getValueType(curr->value);
  if (valueType == Type::unreachable) {
    replaceUntaken(curr->value, curr->condition);
  } else {
    updateBreakValueType(curr->name, valueType);
  }
}